

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

sexp sexp_bignum_expt(sexp ctx,sexp a,sexp b)

{
  void *__s;
  ulong uVar1;
  bool bVar2;
  sexp psVar3;
  ulong uVar4;
  ulong uVar5;
  sexp res;
  sexp local_70;
  sexp local_68;
  size_t local_60;
  sexp local_58;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  
  uVar4 = (long)b >> 1;
  local_50.var = &local_70;
  local_70 = (sexp)0x43e;
  local_40.var = &local_68;
  local_68 = (sexp)0x43e;
  local_40.next = &local_50;
  local_50.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_40;
  local_58 = b;
  local_70 = sexp_fixnum_to_bignum(ctx,(sexp)&DAT_00000003);
  uVar5 = (a->value).string.offset;
  local_60 = uVar5 * 8;
  psVar3 = sexp_alloc_tagged_aux(ctx,uVar5 * 8 + 0x18,0xc);
  (psVar3->value).string.offset = uVar5;
  uVar1 = (a->value).string.offset;
  if (uVar1 < uVar5) {
    uVar5 = uVar1;
  }
  (psVar3->value).flonum_bits[0] = (a->value).flonum_bits[0];
  __s = (void *)((long)&psVar3->value + 0x10);
  memset(__s,0,local_60);
  memmove(__s,(void *)((long)&a->value + 0x10),uVar5 << 3);
  local_68 = psVar3;
  if ((sexp)&DAT_00000001 < local_58) {
    uVar5 = -uVar4;
    if (0 < (long)uVar4) {
      uVar5 = uVar4;
    }
    do {
      if ((uVar5 & 1) != 0) {
        local_70 = sexp_bignum_mul(ctx,(sexp)0x0,local_70,local_68);
      }
      local_68 = sexp_bignum_mul(ctx,(sexp)0x0,local_68,local_68);
      bVar2 = 1 < uVar5;
      uVar5 = uVar5 >> 1;
    } while (bVar2);
  }
  if ((long)uVar4 < 0) {
    psVar3 = sexp_fixnum_to_bignum(ctx,(sexp)&DAT_00000003);
    local_70 = sexp_div(ctx,psVar3,local_70);
  }
  (ctx->value).context.saves = local_50.next;
  psVar3 = sexp_bignum_normalize(local_70);
  return psVar3;
}

Assistant:

sexp sexp_bignum_expt (sexp ctx, sexp a, sexp b) {
  sexp_sint_t e = sexp_unbox_fixnum(b);
  sexp_sint_t abs_e;
  if (e < 0)
    abs_e = -e;
  else
    abs_e = e;
  sexp_gc_var2(res, acc);
  sexp_gc_preserve2(ctx, res, acc);
  res = sexp_fixnum_to_bignum(ctx, SEXP_ONE);
  acc = sexp_copy_bignum(ctx, NULL, a, 0);
  for (; abs_e; abs_e>>=1, acc=sexp_bignum_mul(ctx, NULL, acc, acc))
    if (abs_e & 1)
      res = sexp_bignum_mul(ctx, NULL, res, acc);
  if (e < 0)
    res = sexp_div(ctx, sexp_fixnum_to_bignum(ctx, SEXP_ONE), res);
  sexp_gc_release2(ctx);
  return sexp_bignum_normalize(res);
}